

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall
QTableViewPrivate::widthHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  long *plVar1;
  Data *pDVar2;
  Data *this_00;
  Representation RVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QEditorInfo *pQVar7;
  Node<QWidget_*,_QHashDummyValue> *pNVar8;
  QSize QVar9;
  QSize QVar10;
  long *plVar11;
  Span *pSVar12;
  int iVar13;
  long in_FS_OFFSET;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar7 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar2 = (pQVar7->widget).wp.d;
  RVar3.m_i = hint;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar7->widget).wp.value;
    if (((local_40 != (QWidget *)0x0) &&
        (this_00 = (this->super_QAbstractItemViewPrivate).persistent.q_hash.d,
        this_00 != (Data *)0x0)) &&
       (pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                 findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_00,
                                    &local_40), pNVar8 != (Node<QWidget_*,_QHashDummyValue> *)0x0))
    {
      RVar3.m_i = (**(code **)(*(long *)local_40 + 0x70))();
      if (RVar3.m_i <= hint) {
        RVar3.m_i = hint;
      }
      QVar9 = QWidget::minimumSize(local_40);
      QVar10 = QWidget::maximumSize(local_40);
      if (QVar10.wd.m_i.m_i < RVar3.m_i) {
        RVar3.m_i = QVar10.wd.m_i.m_i;
      }
      if (RVar3.m_i <= QVar9.wd.m_i.m_i) {
        RVar3.m_i = QVar9.wd.m_i.m_i;
      }
    }
  }
  plVar11 = (long *)(**(code **)(*plVar1 + 0x208))(plVar1,index);
  iVar4 = (**(code **)(*plVar11 + 0x68))(plVar11,option,index);
  if (iVar4 < RVar3.m_i) {
    iVar4 = RVar3.m_i;
  }
  iVar5 = iVar4;
  if ((QSpanCollection *)
      (this->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != &this->spans) {
    iVar5 = index->r;
    iVar13 = index->c;
    pSVar12 = QSpanCollection::spanAt(&this->spans,iVar13,iVar5);
    if (((pSVar12 != (Span *)0x0) && (pSVar12->m_left == iVar13)) &&
       ((pSVar12->m_top == iVar5 &&
        (iVar5 = QHeaderView::logicalIndex(this->horizontalHeader,iVar13),
        0 < (pSVar12->m_right - pSVar12->m_left) + 1)))) {
      iVar13 = 0;
      do {
        iVar6 = QHeaderView::visualIndex(this->horizontalHeader,iVar13 + iVar5 + 1);
        iVar6 = QHeaderView::sectionSize(*(QHeaderView **)(plVar1[1] + 0x580),iVar6);
        iVar4 = iVar4 - iVar6;
        iVar13 = iVar13 + 1;
      } while (iVar13 < (pSVar12->m_right - pSVar12->m_left) + 1);
    }
    iVar5 = hint;
    if (hint < iVar4) {
      iVar5 = iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int QTableViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    const int oldHint = hint;
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).width());

    if (hasSpans()) {
        auto span = spans.spanAt(index.column(), index.row());
        if (span && span->m_left == index.column() && span->m_top == index.row()) {
            // spans are screwed up when sections are moved
            const auto left = logicalColumn(span->m_left);
            for (int i = 1; i <= span->width(); ++i)
               hint -= q->columnWidth(visualColumn(left + i));
        }
        hint = std::max(hint, oldHint);
    }
    return hint;
}